

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarBinds.h
# Opt level: O3

void __thiscall VarBind::VarBind(VarBind *this,shared_ptr<OIDType> *oid,SNMP_ERROR_STATUS error)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *__p;
  
  (this->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (oid->super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (oid->super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->type = NULLTYPE;
  __p = (element_type *)operator_new(0x10);
  *(undefined8 *)&__p->_type = 5;
  ((BER_CONTAINER *)&__p->_vptr_BER_CONTAINER)->_vptr_BER_CONTAINER =
       (_func_int **)&PTR__BER_CONTAINER_001156a8;
  (this->value).super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<NullType*>
            (&(this->value).super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NullType *)__p);
  this->errorStatus = error;
  return;
}

Assistant:

VarBind(const SortableOIDType* oid, const std::shared_ptr<BER_CONTAINER>& value): oid(oid->cloneOID()), type(value->_type), value(value){}